

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

SourceContextInfo * __thiscall
Js::ScriptContext::GetSourceContextInfo
          (ScriptContext *this,DWORD_PTR sourceContext,SimpleDataCacheWrapper *dataCacheWrapper)

{
  SourceDynamicProfileManager *this_00;
  bool bVar1;
  DWORD_PTR local_28;
  DWORD_PTR sourceContext_local;
  SourceContextInfo *sourceContextInfo;
  
  if (sourceContext == 0xffffffffffffffff) {
    sourceContext_local =
         (DWORD_PTR)
         (((this->super_ScriptContextBase).javascriptLibrary)->cache).noContextSourceContextInfo.ptr
    ;
  }
  else {
    local_28 = sourceContext;
    EnsureSourceContextInfoMap(this);
    sourceContext_local = 0;
    bVar1 = JsUtil::
            BaseDictionary<unsigned_long,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::TryGetValue<unsigned_long>
                      ((((this->super_ScriptContextBase).javascriptLibrary)->cache).
                       sourceContextInfoMap.ptr,&local_28,(SourceContextInfo **)&sourceContext_local
                      );
    if (bVar1) {
      if ((((dataCacheWrapper != (SimpleDataCacheWrapper *)0x0) &&
           (this_00 = *(SourceDynamicProfileManager **)(sourceContext_local + 0x30),
           this_00 != (SourceDynamicProfileManager *)0x0)) &&
          ((this_00->dataCacheWrapper).ptr == (SimpleDataCacheWrapper *)0x0)) &&
         (this->startupComplete == false)) {
        SourceDynamicProfileManager::LoadFromProfileCache
                  (this_00,dataCacheWrapper,*(LPCWSTR *)(sourceContext_local + 0x20));
      }
    }
    else {
      sourceContext_local = 0;
    }
  }
  return (SourceContextInfo *)sourceContext_local;
}

Assistant:

SourceContextInfo *  ScriptContext::GetSourceContextInfo(DWORD_PTR sourceContext, SimpleDataCacheWrapper* dataCacheWrapper)
    {
        if (sourceContext == Js::Constants::NoHostSourceContext)
        {
            return this->Cache()->noContextSourceContextInfo;
        }

        // We only init sourceContextInfoMap, don't need to lock.
        EnsureSourceContextInfoMap();
        SourceContextInfo * sourceContextInfo = nullptr;
        if (this->Cache()->sourceContextInfoMap->TryGetValue(sourceContext, &sourceContextInfo))
        {
#if ENABLE_PROFILE_INFO
            if (dataCacheWrapper &&
                sourceContextInfo->sourceDynamicProfileManager != nullptr &&
                !sourceContextInfo->sourceDynamicProfileManager->IsProfileLoadedFromWinInet() &&
                !this->startupComplete)
            {
                bool profileLoaded = sourceContextInfo->sourceDynamicProfileManager->LoadFromProfileCache(dataCacheWrapper, sourceContextInfo->url);
                if (profileLoaded)
                {
                    JS_ETW(EventWriteJSCRIPT_PROFILE_LOAD(sourceContextInfo->dwHostSourceContext, this));
                }
            }
#endif
            return sourceContextInfo;
        }
        return nullptr;
    }